

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O2

LY_ERR ly_time_str2time(char *value,time_t *time,char **fractions_s)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  time_t tVar7;
  ushort **ppuVar8;
  char *pcVar9;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  char *__nptr;
  char *ptr;
  tm local_68;
  
  local_68.tm_gmtoff = 0;
  local_68.tm_zone = (char *)0x0;
  local_68.tm_wday = 0;
  local_68.tm_yday = 0;
  local_68.tm_isdst = 0;
  local_68._36_4_ = 0;
  if (value == (char *)0x0) {
    pcVar11 = "value";
  }
  else {
    sVar6 = strlen(value);
    if (sVar6 < 0x12) {
      pcVar11 = "strlen(value) > 17";
    }
    else {
      if (time != (time_t *)0x0) {
        local_68.tm_year = atoi(value);
        local_68.tm_year = local_68.tm_year + -0x76c;
        iVar2 = atoi(value + 5);
        local_68.tm_mon = iVar2 - 1U;
        uVar3 = atoi(value + 8);
        local_68.tm_mday = uVar3;
        uVar4 = atoi(value + 0xb);
        local_68.tm_hour = uVar4;
        uVar5 = atoi(value + 0xe);
        local_68.tm_min = uVar5;
        local_68.tm_sec = atoi(value + 0x11);
        if (iVar2 < 0xd) {
          if (uVar3 - 0x20 < 0xffffffe1) {
            pcVar11 = "Invalid date-and-time day of month \"%d\".";
            uVar12 = (ulong)uVar3;
          }
          else if ((int)uVar4 < 0x18) {
            if ((int)uVar5 < 0x3c) {
              if (local_68.tm_sec < 0x3d) {
                tVar7 = timegm(&local_68);
                bVar1 = value[0x13];
                if (bVar1 == 0x2e) {
                  pcVar11 = value + 0x14;
                  ppuVar8 = __ctype_b_loc();
                  uVar3 = 0;
                  do {
                    uVar4 = uVar3;
                    sVar6 = (size_t)uVar4;
                    uVar3 = uVar4 + 1;
                  } while ((*(byte *)((long)*ppuVar8 + (long)pcVar11[sVar6] * 2 + 1) & 8) != 0);
                  if (uVar4 + 1 == 1) {
                    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,
                           "Missing date-and-time fractions after \'.\'.");
                    return LY_EINVAL;
                  }
                  uVar12 = (ulong)(uVar4 + 0x14);
                  bVar1 = value[uVar12];
                }
                else {
                  uVar12 = 0x13;
                  sVar6 = 0;
                  pcVar11 = (char *)0x0;
                }
                if ((bVar1 | 0x20) == 0x7a) {
                  lVar10 = 0;
LAB_00127dc5:
                  *time = tVar7 - lVar10;
                  if (fractions_s != (char **)0x0) {
                    if (pcVar11 == (char *)0x0) {
                      *fractions_s = (char *)0x0;
                    }
                    else {
                      pcVar11 = strndup(pcVar11,sVar6);
                      *fractions_s = pcVar11;
                      if (pcVar11 == (char *)0x0) {
                        return LY_EMEM;
                      }
                    }
                  }
                  return LY_SUCCESS;
                }
                __nptr = value + uVar12;
                pcVar9 = (char *)strtol(__nptr,&ptr,10);
                if ((long)pcVar9 < 0x18) {
                  if (*ptr == ':') {
                    __nptr = (char *)strtol(ptr + 1,(char **)0x0,10);
                    if (__nptr < (char *)0x3c) {
                      lVar10 = 0x3c;
                      if ((long)pcVar9 * 0xe10 < 0) {
                        lVar10 = -0x3c;
                      }
                      lVar10 = (long)__nptr * lVar10 + (long)pcVar9 * 0xe10;
                      goto LAB_00127dc5;
                    }
                    pcVar11 = "Invalid date-and-time timezone minutes \"%li\".";
                  }
                  else {
                    pcVar11 = "Invalid date-and-time timezone hour \"%s\".";
                  }
                }
                else {
                  pcVar11 = "Invalid date-and-time timezone hour \"%li\".";
                  __nptr = pcVar9;
                }
                ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,pcVar11,__nptr);
                return LY_EINVAL;
              }
              pcVar11 = "Invalid date-and-time seconds \"%d\".";
              uVar12 = (ulong)(uint)local_68.tm_sec;
            }
            else {
              pcVar11 = "Invalid date-and-time minutes \"%d\".";
              uVar12 = (ulong)uVar5;
            }
          }
          else {
            pcVar11 = "Invalid date-and-time hours \"%d\".";
            uVar12 = (ulong)uVar4;
          }
        }
        else {
          pcVar11 = "Invalid date-and-time month \"%d\".";
          uVar12 = (ulong)(iVar2 - 1U);
        }
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,pcVar11,uVar12);
        return LY_EINVAL;
      }
      pcVar11 = "time";
    }
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar11,"ly_time_str2time");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_time_str2time(const char *value, time_t *time, char **fractions_s)
{
    struct tm tm = {0};
    uint32_t i, frac_len;
    const char *frac;
    char *ptr;
    int64_t shift, shift_m;
    time_t t;

    LY_CHECK_ARG_RET(NULL, value, strlen(value) > 17, time, LY_EINVAL);

    tm.tm_year = atoi(&value[0]) - 1900;
    tm.tm_mon = atoi(&value[5]) - 1;
    tm.tm_mday = atoi(&value[8]);
    tm.tm_hour = atoi(&value[11]);
    tm.tm_min = atoi(&value[14]);
    tm.tm_sec = atoi(&value[17]);

    /* explicit checks for some gross errors */
    if (tm.tm_mon > 11) {
        LOGERR(NULL, LY_EINVAL, "Invalid date-and-time month \"%d\".", tm.tm_mon);
        return LY_EINVAL;
    }
    if ((tm.tm_mday < 1) || (tm.tm_mday > 31)) {
        LOGERR(NULL, LY_EINVAL, "Invalid date-and-time day of month \"%d\".", tm.tm_mday);
        return LY_EINVAL;
    }
    if (tm.tm_hour > 23) {
        LOGERR(NULL, LY_EINVAL, "Invalid date-and-time hours \"%d\".", tm.tm_hour);
        return LY_EINVAL;
    }
    if (tm.tm_min > 59) {
        LOGERR(NULL, LY_EINVAL, "Invalid date-and-time minutes \"%d\".", tm.tm_min);
        return LY_EINVAL;
    }
    if (tm.tm_sec > 60) {
        LOGERR(NULL, LY_EINVAL, "Invalid date-and-time seconds \"%d\".", tm.tm_sec);
        return LY_EINVAL;
    }

    t = timegm(&tm);
    i = 19;

    /* fractions of a second */
    if (value[i] == '.') {
        ++i;
        frac = &value[i];
        for (frac_len = 0; isdigit(frac[frac_len]); ++frac_len) {}
        if (!frac_len) {
            LOGERR(NULL, LY_EINVAL, "Missing date-and-time fractions after '.'.");
            return LY_EINVAL;
        }

        i += frac_len;
    } else {
        frac = NULL;
    }

    /* apply offset */
    if ((value[i] == 'Z') || (value[i] == 'z')) {
        /* zero shift */
        shift = 0;
    } else {
        value += i;
        shift = strtol(value, &ptr, 10);
        if (shift > 23) {
            LOGERR(NULL, LY_EINVAL, "Invalid date-and-time timezone hour \"%" PRIi64 "\".", shift);
            return LY_EINVAL;
        } else if (ptr[0] != ':') {
            LOGERR(NULL, LY_EINVAL, "Invalid date-and-time timezone hour \"%s\".", value);
            return LY_EINVAL;
        }
        shift = shift * 60 * 60; /* convert from hours to seconds */

        value = ptr + 1;
        shift_m = strtol(value, NULL, 10);
        if ((shift_m < 0) || (shift_m > 59)) {
            LOGERR(NULL, LY_EINVAL, "Invalid date-and-time timezone minutes \"%" PRIi64 "\".", shift_m);
            return LY_EINVAL;
        }
        shift_m *= 60; /* convert from minutes to seconds */

        /* correct sign */
        if (shift < 0) {
            shift_m *= -1;
        }

        /* connect hours and minutes of the shift */
        shift = shift + shift_m;
    }

    /* we have to shift to the opposite way to correct the time */
    t -= shift;

    *time = t;
    if (fractions_s) {
        if (frac) {
            *fractions_s = strndup(frac, frac_len);
            LY_CHECK_RET(!*fractions_s, LY_EMEM);
        } else {
            *fractions_s = NULL;
        }
    }
    return LY_SUCCESS;
}